

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

void __thiscall
cnn::GaussianNoise::forward_impl
          (GaussianNoise *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs
          ,Tensor *fx)

{
  Tensor *pTVar1;
  float *pfVar2;
  float *pfVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  byte bVar8;
  byte bVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  Index index_1;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ushort uVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  int iVar25;
  int iVar26;
  Tensor m;
  undefined1 local_68 [48];
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> vStack_38;
  
  local_68._40_8_ = (this->super_Node).aux_mem;
  local_68._32_4_ = (this->super_Node).dim.bd;
  local_68._0_8_ = *(undefined8 *)(this->super_Node).dim.d;
  local_68._8_8_ = *(undefined8 *)((this->super_Node).dim.d + 2);
  local_68._16_8_ = *(undefined8 *)((this->super_Node).dim.d + 4);
  local_68._24_8_ = *(undefined8 *)((this->super_Node).dim.d + 6);
  vStack_38.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_38.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_38.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TensorTools::RandomizeNormal(0.0,this->stddev,(Tensor *)local_68);
  pTVar1 = *(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  uVar12 = (ulong)(pTVar1->d).nd;
  iVar26 = 1;
  iVar25 = 1;
  if (uVar12 != 0) {
    auVar18 = vpbroadcastq_avx512f();
    auVar19 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar11 = 0;
    auVar20 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar21 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar22 = vmovdqa64_avx512f(auVar19);
      auVar19 = vpbroadcastq_avx512f();
      auVar23 = vporq_avx512f(auVar19,auVar20);
      auVar19 = vporq_avx512f(auVar19,auVar21);
      uVar7 = vpcmpuq_avx512f(auVar19,auVar18,2);
      bVar8 = (byte)uVar7;
      uVar7 = vpcmpuq_avx512f(auVar23,auVar18,2);
      bVar9 = (byte)uVar7;
      uVar16 = CONCAT11(bVar9,bVar8);
      auVar19 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar1->d).d + uVar11));
      auVar23._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar19._4_4_;
      auVar23._0_4_ = (uint)(bVar8 & 1) * auVar19._0_4_;
      auVar23._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar19._8_4_;
      auVar23._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar19._12_4_;
      auVar23._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar19._16_4_;
      auVar23._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar19._20_4_;
      auVar23._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar19._24_4_;
      auVar23._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar19._28_4_;
      auVar23._32_4_ = (uint)(bVar9 & 1) * auVar19._32_4_;
      auVar23._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar19._36_4_;
      auVar23._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar19._40_4_;
      auVar23._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar19._44_4_;
      auVar23._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar19._48_4_;
      auVar23._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar19._52_4_;
      auVar23._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar19._56_4_;
      auVar23._60_4_ = (uint)(bVar9 >> 7) * auVar19._60_4_;
      auVar19 = vpmulld_avx512f(auVar23,auVar22);
      uVar11 = uVar11 + 0x10;
    } while ((uVar12 + 0xf & 0x1fffffff0) != uVar11);
    auVar19 = vmovdqa32_avx512f(auVar19);
    auVar18._0_4_ = (uint)(bVar8 & 1) * auVar19._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar22._0_4_;
    bVar4 = (bool)((byte)(uVar16 >> 1) & 1);
    auVar18._4_4_ = (uint)bVar4 * auVar19._4_4_ | (uint)!bVar4 * auVar22._4_4_;
    bVar4 = (bool)((byte)(uVar16 >> 2) & 1);
    auVar18._8_4_ = (uint)bVar4 * auVar19._8_4_ | (uint)!bVar4 * auVar22._8_4_;
    bVar4 = (bool)((byte)(uVar16 >> 3) & 1);
    auVar18._12_4_ = (uint)bVar4 * auVar19._12_4_ | (uint)!bVar4 * auVar22._12_4_;
    bVar4 = (bool)((byte)(uVar16 >> 4) & 1);
    auVar18._16_4_ = (uint)bVar4 * auVar19._16_4_ | (uint)!bVar4 * auVar22._16_4_;
    bVar4 = (bool)((byte)(uVar16 >> 5) & 1);
    auVar18._20_4_ = (uint)bVar4 * auVar19._20_4_ | (uint)!bVar4 * auVar22._20_4_;
    bVar4 = (bool)((byte)(uVar16 >> 6) & 1);
    auVar18._24_4_ = (uint)bVar4 * auVar19._24_4_ | (uint)!bVar4 * auVar22._24_4_;
    bVar4 = (bool)((byte)(uVar16 >> 7) & 1);
    auVar18._28_4_ = (uint)bVar4 * auVar19._28_4_ | (uint)!bVar4 * auVar22._28_4_;
    auVar18._32_4_ = (uint)(bVar9 & 1) * auVar19._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar22._32_4_;
    bVar4 = (bool)(bVar9 >> 1 & 1);
    auVar18._36_4_ = (uint)bVar4 * auVar19._36_4_ | (uint)!bVar4 * auVar22._36_4_;
    bVar4 = (bool)(bVar9 >> 2 & 1);
    auVar18._40_4_ = (uint)bVar4 * auVar19._40_4_ | (uint)!bVar4 * auVar22._40_4_;
    bVar4 = (bool)(bVar9 >> 3 & 1);
    auVar18._44_4_ = (uint)bVar4 * auVar19._44_4_ | (uint)!bVar4 * auVar22._44_4_;
    bVar4 = (bool)(bVar9 >> 4 & 1);
    auVar18._48_4_ = (uint)bVar4 * auVar19._48_4_ | (uint)!bVar4 * auVar22._48_4_;
    bVar4 = (bool)(bVar9 >> 5 & 1);
    auVar18._52_4_ = (uint)bVar4 * auVar19._52_4_ | (uint)!bVar4 * auVar22._52_4_;
    bVar4 = (bool)(bVar9 >> 6 & 1);
    auVar18._56_4_ = (uint)bVar4 * auVar19._56_4_ | (uint)!bVar4 * auVar22._56_4_;
    auVar18._60_4_ =
         (uint)(bVar9 >> 7) * auVar19._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar22._60_4_;
    auVar17 = vextracti64x4_avx512f(auVar18,1);
    auVar18 = vpmulld_avx512f(auVar18,ZEXT3264(auVar17));
    auVar5 = vpmulld_avx(auVar18._0_16_,auVar18._16_16_);
    auVar6 = vpshufd_avx(auVar5,0xee);
    auVar5 = vpmulld_avx(auVar5,auVar6);
    auVar6 = vpshufd_avx(auVar5,0x55);
    auVar5 = vpmulld_avx(auVar5,auVar6);
    iVar25 = auVar5._0_4_;
  }
  if ((ulong)local_68._24_8_ >> 0x20 != 0) {
    auVar18 = vpbroadcastq_avx512f();
    auVar19 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar12 = 0;
    auVar20 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar21 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar22 = vmovdqa64_avx512f(auVar19);
      auVar19 = vpbroadcastq_avx512f();
      auVar23 = vporq_avx512f(auVar19,auVar20);
      auVar19 = vporq_avx512f(auVar19,auVar21);
      uVar7 = vpcmpuq_avx512f(auVar19,auVar18,2);
      bVar8 = (byte)uVar7;
      uVar7 = vpcmpuq_avx512f(auVar23,auVar18,2);
      bVar9 = (byte)uVar7;
      uVar16 = CONCAT11(bVar9,bVar8);
      auVar23 = vmovdqu32_avx512f(*(undefined1 (*) [64])(local_68 + uVar12 * 4));
      auVar19._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar23._4_4_;
      auVar19._0_4_ = (uint)(bVar8 & 1) * auVar23._0_4_;
      auVar19._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar23._8_4_;
      auVar19._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar23._12_4_;
      auVar19._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar23._16_4_;
      auVar19._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar23._20_4_;
      auVar19._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar23._24_4_;
      auVar19._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar23._28_4_;
      auVar19._32_4_ = (uint)(bVar9 & 1) * auVar23._32_4_;
      auVar19._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar23._36_4_;
      auVar19._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar23._40_4_;
      auVar19._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar23._44_4_;
      auVar19._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar23._48_4_;
      auVar19._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar23._52_4_;
      auVar19._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar23._56_4_;
      auVar19._60_4_ = (uint)(bVar9 >> 7) * auVar23._60_4_;
      auVar19 = vpmulld_avx512f(auVar19,auVar22);
      uVar12 = uVar12 + 0x10;
    } while ((((ulong)local_68._24_8_ >> 0x20) + 0xf & 0x1fffffff0) != uVar12);
    auVar18 = vmovdqa32_avx512f(auVar19);
    auVar20._0_4_ = (uint)(bVar8 & 1) * auVar18._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar22._0_4_;
    bVar4 = (bool)((byte)(uVar16 >> 1) & 1);
    auVar20._4_4_ = (uint)bVar4 * auVar18._4_4_ | (uint)!bVar4 * auVar22._4_4_;
    bVar4 = (bool)((byte)(uVar16 >> 2) & 1);
    auVar20._8_4_ = (uint)bVar4 * auVar18._8_4_ | (uint)!bVar4 * auVar22._8_4_;
    bVar4 = (bool)((byte)(uVar16 >> 3) & 1);
    auVar20._12_4_ = (uint)bVar4 * auVar18._12_4_ | (uint)!bVar4 * auVar22._12_4_;
    bVar4 = (bool)((byte)(uVar16 >> 4) & 1);
    auVar20._16_4_ = (uint)bVar4 * auVar18._16_4_ | (uint)!bVar4 * auVar22._16_4_;
    bVar4 = (bool)((byte)(uVar16 >> 5) & 1);
    auVar20._20_4_ = (uint)bVar4 * auVar18._20_4_ | (uint)!bVar4 * auVar22._20_4_;
    bVar4 = (bool)((byte)(uVar16 >> 6) & 1);
    auVar20._24_4_ = (uint)bVar4 * auVar18._24_4_ | (uint)!bVar4 * auVar22._24_4_;
    bVar4 = (bool)((byte)(uVar16 >> 7) & 1);
    auVar20._28_4_ = (uint)bVar4 * auVar18._28_4_ | (uint)!bVar4 * auVar22._28_4_;
    auVar20._32_4_ = (uint)(bVar9 & 1) * auVar18._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar22._32_4_;
    bVar4 = (bool)(bVar9 >> 1 & 1);
    auVar20._36_4_ = (uint)bVar4 * auVar18._36_4_ | (uint)!bVar4 * auVar22._36_4_;
    bVar4 = (bool)(bVar9 >> 2 & 1);
    auVar20._40_4_ = (uint)bVar4 * auVar18._40_4_ | (uint)!bVar4 * auVar22._40_4_;
    bVar4 = (bool)(bVar9 >> 3 & 1);
    auVar20._44_4_ = (uint)bVar4 * auVar18._44_4_ | (uint)!bVar4 * auVar22._44_4_;
    bVar4 = (bool)(bVar9 >> 4 & 1);
    auVar20._48_4_ = (uint)bVar4 * auVar18._48_4_ | (uint)!bVar4 * auVar22._48_4_;
    bVar4 = (bool)(bVar9 >> 5 & 1);
    auVar20._52_4_ = (uint)bVar4 * auVar18._52_4_ | (uint)!bVar4 * auVar22._52_4_;
    bVar4 = (bool)(bVar9 >> 6 & 1);
    auVar20._56_4_ = (uint)bVar4 * auVar18._56_4_ | (uint)!bVar4 * auVar22._56_4_;
    auVar20._60_4_ =
         (uint)(bVar9 >> 7) * auVar18._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar22._60_4_;
    auVar17 = vextracti64x4_avx512f(auVar20,1);
    auVar18 = vpmulld_avx512f(auVar20,ZEXT3264(auVar17));
    auVar5 = vpmulld_avx(auVar18._0_16_,auVar18._16_16_);
    auVar6 = vpshufd_avx(auVar5,0xee);
    auVar5 = vpmulld_avx(auVar5,auVar6);
    auVar6 = vpshufd_avx(auVar5,0x55);
    auVar5 = vpmulld_avx(auVar5,auVar6);
    iVar26 = auVar5._0_4_;
  }
  if (iVar25 * (pTVar1->d).bd != iVar26 * local_68._32_4_) {
    __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<float>, Lhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>, Rhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>]"
                 );
  }
  uVar12 = (ulong)(fx->d).nd;
  if (uVar12 == 0) {
    iVar25 = 1;
  }
  else {
    auVar18 = vpbroadcastq_avx512f();
    auVar19 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar11 = 0;
    auVar20 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar21 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar22 = vmovdqa64_avx512f(auVar19);
      auVar19 = vpbroadcastq_avx512f();
      auVar23 = vporq_avx512f(auVar19,auVar20);
      auVar19 = vporq_avx512f(auVar19,auVar21);
      uVar7 = vpcmpuq_avx512f(auVar19,auVar18,2);
      bVar8 = (byte)uVar7;
      uVar7 = vpcmpuq_avx512f(auVar23,auVar18,2);
      bVar9 = (byte)uVar7;
      uVar16 = CONCAT11(bVar9,bVar8);
      auVar19 = vmovdqu32_avx512f(*(undefined1 (*) [64])((fx->d).d + uVar11));
      auVar24._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar19._4_4_;
      auVar24._0_4_ = (uint)(bVar8 & 1) * auVar19._0_4_;
      auVar24._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar19._8_4_;
      auVar24._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar19._12_4_;
      auVar24._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar19._16_4_;
      auVar24._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar19._20_4_;
      auVar24._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar19._24_4_;
      auVar24._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar19._28_4_;
      auVar24._32_4_ = (uint)(bVar9 & 1) * auVar19._32_4_;
      auVar24._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar19._36_4_;
      auVar24._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar19._40_4_;
      auVar24._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar19._44_4_;
      auVar24._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar19._48_4_;
      auVar24._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar19._52_4_;
      auVar24._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar19._56_4_;
      auVar24._60_4_ = (uint)(bVar9 >> 7) * auVar19._60_4_;
      auVar19 = vpmulld_avx512f(auVar24,auVar22);
      uVar11 = uVar11 + 0x10;
    } while ((uVar12 + 0xf & 0x1fffffff0) != uVar11);
    auVar18 = vmovdqa32_avx512f(auVar19);
    auVar21._0_4_ = (uint)(bVar8 & 1) * auVar18._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar22._0_4_;
    bVar4 = (bool)((byte)(uVar16 >> 1) & 1);
    auVar21._4_4_ = (uint)bVar4 * auVar18._4_4_ | (uint)!bVar4 * auVar22._4_4_;
    bVar4 = (bool)((byte)(uVar16 >> 2) & 1);
    auVar21._8_4_ = (uint)bVar4 * auVar18._8_4_ | (uint)!bVar4 * auVar22._8_4_;
    bVar4 = (bool)((byte)(uVar16 >> 3) & 1);
    auVar21._12_4_ = (uint)bVar4 * auVar18._12_4_ | (uint)!bVar4 * auVar22._12_4_;
    bVar4 = (bool)((byte)(uVar16 >> 4) & 1);
    auVar21._16_4_ = (uint)bVar4 * auVar18._16_4_ | (uint)!bVar4 * auVar22._16_4_;
    bVar4 = (bool)((byte)(uVar16 >> 5) & 1);
    auVar21._20_4_ = (uint)bVar4 * auVar18._20_4_ | (uint)!bVar4 * auVar22._20_4_;
    bVar4 = (bool)((byte)(uVar16 >> 6) & 1);
    auVar21._24_4_ = (uint)bVar4 * auVar18._24_4_ | (uint)!bVar4 * auVar22._24_4_;
    bVar4 = (bool)((byte)(uVar16 >> 7) & 1);
    auVar21._28_4_ = (uint)bVar4 * auVar18._28_4_ | (uint)!bVar4 * auVar22._28_4_;
    auVar21._32_4_ = (uint)(bVar9 & 1) * auVar18._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar22._32_4_;
    bVar4 = (bool)(bVar9 >> 1 & 1);
    auVar21._36_4_ = (uint)bVar4 * auVar18._36_4_ | (uint)!bVar4 * auVar22._36_4_;
    bVar4 = (bool)(bVar9 >> 2 & 1);
    auVar21._40_4_ = (uint)bVar4 * auVar18._40_4_ | (uint)!bVar4 * auVar22._40_4_;
    bVar4 = (bool)(bVar9 >> 3 & 1);
    auVar21._44_4_ = (uint)bVar4 * auVar18._44_4_ | (uint)!bVar4 * auVar22._44_4_;
    bVar4 = (bool)(bVar9 >> 4 & 1);
    auVar21._48_4_ = (uint)bVar4 * auVar18._48_4_ | (uint)!bVar4 * auVar22._48_4_;
    bVar4 = (bool)(bVar9 >> 5 & 1);
    auVar21._52_4_ = (uint)bVar4 * auVar18._52_4_ | (uint)!bVar4 * auVar22._52_4_;
    bVar4 = (bool)(bVar9 >> 6 & 1);
    auVar21._56_4_ = (uint)bVar4 * auVar18._56_4_ | (uint)!bVar4 * auVar22._56_4_;
    auVar21._60_4_ =
         (uint)(bVar9 >> 7) * auVar18._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar22._60_4_;
    auVar17 = vextracti64x4_avx512f(auVar21,1);
    auVar18 = vpmulld_avx512f(auVar21,ZEXT3264(auVar17));
    auVar5 = vpmulld_avx(auVar18._0_16_,auVar18._16_16_);
    auVar6 = vpshufd_avx(auVar5,0xee);
    auVar5 = vpmulld_avx(auVar5,auVar6);
    auVar6 = vpshufd_avx(auVar5,0x55);
    auVar5 = vpmulld_avx(auVar5,auVar6);
    iVar25 = auVar5._0_4_;
  }
  uVar10 = iVar25 * (fx->d).bd;
  uVar12 = (ulong)uVar10;
  if (uVar10 != iVar26 * local_68._32_4_) {
    __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                  "void Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float, -1, 1>>>::resize(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, 1>>]"
                 );
  }
  pfVar2 = fx->v;
  uVar11 = uVar12;
  if ((((ulong)pfVar2 & 3) == 0) &&
     (uVar11 = (ulong)(-((uint)((ulong)pfVar2 >> 2) & 0x3fffffff) & 0xf), uVar12 <= uVar11)) {
    uVar11 = uVar12;
  }
  pfVar3 = pTVar1->v;
  uVar14 = uVar12 - uVar11;
  uVar13 = uVar14 + 0xf;
  if (-1 < (long)uVar14) {
    uVar13 = uVar14;
  }
  if (uVar11 != 0) {
    uVar15 = 0;
    do {
      pfVar2[uVar15] = *(float *)(local_68._40_8_ + uVar15 * 4) + pfVar3[uVar15];
      uVar15 = uVar15 + 1;
    } while (uVar11 != uVar15);
  }
  uVar13 = (uVar13 & 0xfffffffffffffff0) + uVar11;
  if (0xf < (long)uVar14) {
    do {
      auVar18 = vaddps_avx512f(*(undefined1 (*) [64])(local_68._40_8_ + uVar11 * 4),
                               *(undefined1 (*) [64])(pfVar3 + uVar11));
      *(undefined1 (*) [64])(pfVar2 + uVar11) = auVar18;
      uVar11 = uVar11 + 0x10;
    } while ((long)uVar11 < (long)uVar13);
  }
  if ((long)uVar13 < (long)uVar12) {
    do {
      pfVar2[uVar13] = *(float *)(local_68._40_8_ + uVar13 * 4) + pfVar3[uVar13];
      uVar13 = uVar13 + 1;
    } while (uVar12 != uVar13);
  }
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&vStack_38);
  return;
}

Assistant:

void GaussianNoise::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("GaussianNoise not yet implemented for CUDA");
#else
  Tensor m(dim, (float*)aux_mem);
  TensorTools::RandomizeNormal(0, stddev, m);
  fx.vec() = xs[0]->vec() + m.vec();
#endif
}